

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
UnsignedLongLongsEqualFailure::UnsignedLongLongsEqualFailure
          (UnsignedLongLongsEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          cpputest_ulonglong expected,cpputest_ulonglong actual,SimpleString *text)

{
  SimpleString *in_RDI;
  SimpleString expectedReported;
  SimpleString actualReported;
  SimpleString eDecimal;
  SimpleString aDecimal;
  SimpleString *in_stack_ffffffffffffff00;
  SimpleString *in_stack_ffffffffffffff08;
  SimpleString *in_stack_ffffffffffffff10;
  TestFailure *in_stack_ffffffffffffff18;
  SimpleString *in_stack_ffffffffffffff20;
  SimpleString *in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  char in_stack_ffffffffffffff47;
  TestFailure *in_stack_ffffffffffffff48;
  TestFailure *in_stack_ffffffffffffff50;
  
  TestFailure::TestFailure
            (in_stack_ffffffffffffff50,(UtestShell *)in_stack_ffffffffffffff48,
             (char *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  in_RDI->buffer_ = (char *)&PTR__UnsignedLongLongsEqualFailure_001c3ba0;
  TestFailure::createUserText
            (in_stack_ffffffffffffff48,
             (SimpleString *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  SimpleString::operator=(in_stack_ffffffffffffff00,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x17b1b1);
  StringFrom((cpputest_ulonglong)in_RDI);
  StringFrom((cpputest_ulonglong)in_RDI);
  SimpleString::padStringsToSameLength
            ((SimpleString *)in_stack_ffffffffffffff50,(SimpleString *)in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff47);
  SimpleString::SimpleString(in_stack_ffffffffffffff00,(char *)in_RDI);
  SimpleString::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  BracketsFormattedHexStringFrom((cpputest_ulonglong)in_stack_ffffffffffffff28);
  SimpleString::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  SimpleString::~SimpleString((SimpleString *)0x17b25e);
  SimpleString::~SimpleString((SimpleString *)0x17b268);
  SimpleString::~SimpleString((SimpleString *)0x17b272);
  SimpleString::SimpleString(in_stack_ffffffffffffff00,(char *)in_RDI);
  SimpleString::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  BracketsFormattedHexStringFrom((cpputest_ulonglong)in_stack_ffffffffffffff28);
  SimpleString::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  SimpleString::~SimpleString((SimpleString *)0x17b2d2);
  SimpleString::~SimpleString((SimpleString *)0x17b2dc);
  SimpleString::~SimpleString((SimpleString *)0x17b2e6);
  TestFailure::createButWasString
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  SimpleString::operator+=(in_stack_ffffffffffffff00,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x17b321);
  SimpleString::~SimpleString((SimpleString *)0x17b32b);
  SimpleString::~SimpleString((SimpleString *)0x17b338);
  SimpleString::~SimpleString((SimpleString *)0x17b345);
  SimpleString::~SimpleString((SimpleString *)0x17b352);
  return;
}

Assistant:

UnsignedLongLongsEqualFailure::UnsignedLongLongsEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, cpputest_ulonglong expected, cpputest_ulonglong actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString aDecimal = StringFrom(actual);
    SimpleString eDecimal = StringFrom(expected);

    SimpleString::padStringsToSameLength(aDecimal, eDecimal, ' ');

    SimpleString actualReported = aDecimal + " " + BracketsFormattedHexStringFrom(actual);
    SimpleString expectedReported = eDecimal + " " + BracketsFormattedHexStringFrom(expected);
    message_ += createButWasString(expectedReported, actualReported);
}